

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::StringPtr> * __thiscall
kj::_::NullableValue<kj::StringPtr>::operator=
          (NullableValue<kj::StringPtr> *this,NullableValue<kj::StringPtr> *other)

{
  size_t sVar1;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
    }
    if (other->isSet == true) {
      sVar1 = (other->field_1).value.content.size_;
      (this->field_1).value.content.ptr = (other->field_1).value.content.ptr;
      (this->field_1).value.content.size_ = sVar1;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, other.value);
        isSet = true;
      }
    }
    return *this;
  }